

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunctionBody
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function,
          SRCINFO *srcInfo,SerializedFieldList *definedFields)

{
  code *pcVar1;
  bool bVar2;
  RegexFlags value;
  ProfileId PVar3;
  RegSlot RVar4;
  uint uVar5;
  uint32 debuggerScopeSlotArraySize_00;
  charcount_t cVar6;
  undefined4 *puVar7;
  LoopHeader *pLVar8;
  AsmJsFunctionInfo *pAVar9;
  ByteBlock **ppBVar10;
  PropertyIdArray *propIds_00;
  AuxArray<unsigned_int> *pAVar11;
  ProfileId *pPVar12;
  char16 *sz;
  undefined1 local_78 [8];
  InternalString source;
  RegexPattern *literalRegex;
  uint i_1;
  uint debuggerScopeSlotArraySize;
  PropertyIdArray *propIds;
  HRESULT hr_1;
  HRESULT hr;
  uint i;
  uint loopCount;
  LoopHeader *loopHeaderArray;
  SerializedFieldList *definedFields_local;
  SRCINFO *srcInfo_local;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  bVar2 = FunctionBody::GetIsSerialized(function);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x82f,"(!function->GetIsSerialized())",
                                "!function->GetIsSerialized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  FunctionBody::SetIsSerialized(function,true);
  RVar4 = FunctionBody::GetConstantCount(function);
  if (RVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x833,"(function->GetConstantCount() != 0)",
                                "function->GetConstantCount() != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  RVar4 = FunctionBody::GetVarCount(function);
  if (RVar4 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffffffbff | 0x400);
    RVar4 = FunctionBody::GetVarCount(function);
    PrependInt32(this,builder,L"VarCount",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetConstantCount(function);
  if (RVar4 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffffff7ff | 0x800);
    RVar4 = FunctionBody::GetConstantCount(function);
    PrependInt32(this,builder,L"ConstantCount",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFirstTmpRegister(function);
  PrependInt32(this,builder,L"FirstTmpRegister",RVar4,(BufferBuilderInt32 **)0x0);
  RVar4 = FunctionBody::GetOutParamMaxDepth(function);
  if (RVar4 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffffefff | 0x1000);
    RVar4 = FunctionBody::GetOutParamMaxDepth(function);
    PrependInt32(this,builder,L"OutParamMaxDepth",RVar4,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetByteCodeCount(function);
  PrependInt32(this,builder,L"ByteCodeCount",uVar5,(BufferBuilderInt32 **)0x0);
  uVar5 = FunctionBody::GetByteCodeWithoutLDACount(function);
  PrependInt32(this,builder,L"ByteCodeWithoutLDACount",uVar5,(BufferBuilderInt32 **)0x0);
  uVar5 = FunctionBody::GetByteCodeInLoopCount(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffffdfff | 0x2000);
    uVar5 = FunctionBody::GetByteCodeInLoopCount(function);
    PrependInt32(this,builder,L"ByteCodeInLoopCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  if (function->m_envDepth != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffffbfff | 0x4000);
    PrependInt16(this,builder,L"m_envDepth",function->m_envDepth,(BufferBuilderInt16 **)0x0);
  }
  if (function->m_argUsedForBranch != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffff7fff | 0x8000);
    PrependInt16(this,builder,L"m_argUsedForBranch",function->m_argUsedForBranch,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdLenCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffffeffff | 0x10000);
    PrependInt16(this,builder,L"profiledLdLenCount",function->profiledLdLenCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledLdElemCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffffdffff | 0x20000);
    PrependInt16(this,builder,L"profiledLdElemCount",function->profiledLdElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledStElemCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffffbffff | 0x40000);
    PrependInt16(this,builder,L"profiledStElemCount",function->profiledStElemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledCallSiteCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffff7ffff | 0x80000);
    PrependInt16(this,builder,L"profiledCallSiteCount",function->profiledCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledArrayCallSiteCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffefffff | 0x100000);
    PrependInt16(this,builder,L"profiledArrayCallSiteCount",function->profiledArrayCallSiteCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledDivOrRemCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffdfffff | 0x200000);
    PrependInt16(this,builder,L"profiledDivOrRemCount",function->profiledDivOrRemCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSwitchCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffffbfffff | 0x400000);
    PrependInt16(this,builder,L"profiledSwitchCount",function->profiledSwitchCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledReturnTypeCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffff7fffff | 0x800000);
    PrependInt16(this,builder,L"profiledReturnTypeCount",function->profiledReturnTypeCount,
                 (BufferBuilderInt16 **)0x0);
  }
  if (function->profiledSlotCount != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffeffffff | 0x1000000);
    PrependInt16(this,builder,L"profiledSlotCount",function->profiledSlotCount,
                 (BufferBuilderInt16 **)0x0);
  }
  uVar5 = FunctionBody::GetLoopCount(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffdffffff | 0x2000000);
    uVar5 = FunctionBody::GetLoopCount(function);
    PrependInt32(this,builder,L"LoopCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  if ((function->m_hasFinally & 1U) != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffffbffffff | 0x4000000);
    PrependBool(this,builder,L"m_hasFinally",(bool)(function->m_hasFinally & 1));
  }
  if ((function->hasScopeObject & 1U) != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffff7ffffff | 0x8000000);
    PrependBool(this,builder,L"hasScopeObject",(bool)(function->hasScopeObject & 1));
  }
  if ((function->hasCachedScopePropIds & 1U) != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffefffffff | 0x10000000);
    PrependBool(this,builder,L"hasCachedScopePropIds",(bool)(function->hasCachedScopePropIds & 1));
  }
  uVar5 = FunctionBody::GetForInLoopDepth(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffdfffffff | 0x20000000);
    uVar5 = FunctionBody::GetForInLoopDepth(function);
    PrependInt32(this,builder,L"ForInLoopDepth",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetInlineCacheCount(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffffbfffffff | 0x40000000);
    uVar5 = FunctionBody::GetInlineCacheCount(function);
    PrependInt32(this,builder,L"InlineCacheCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetRootObjectLoadInlineCacheStart(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xffffffff7fffffff | 0x80000000);
    uVar5 = FunctionBody::GetRootObjectLoadInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectLoadInlineCacheStart",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffeffffffff | 0x100000000)
    ;
    uVar5 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectLoadMethodInlineCacheStart",uVar5,
                 (BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetRootObjectStoreInlineCacheStart(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffdffffffff | 0x200000000)
    ;
    uVar5 = FunctionBody::GetRootObjectStoreInlineCacheStart(function);
    PrependInt32(this,builder,L"RootObjectStoreInlineCacheStart",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetIsInstInlineCacheCount(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffffbffffffff | 0x400000000)
    ;
    uVar5 = FunctionBody::GetIsInstInlineCacheCount(function);
    PrependInt32(this,builder,L"IsInstInlineCacheCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetReferencedPropertyIdCount(function);
  if (uVar5 != 0) {
    *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfffffff7ffffffff | 0x800000000)
    ;
    uVar5 = FunctionBody::GetReferencedPropertyIdCount(function);
    PrependInt32(this,builder,L"ReferencedPropertyIdCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetObjLiteralCount(function);
  if (uVar5 != 0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffffefffffffff | 0x1000000000);
    uVar5 = FunctionBody::GetObjLiteralCount(function);
    PrependInt32(this,builder,L"ObjLiteralCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetLiteralRegexCount(function);
  if (uVar5 != 0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffffdfffffffff | 0x2000000000);
    uVar5 = FunctionBody::GetLiteralRegexCount(function);
    PrependInt32(this,builder,L"LiteralRegexCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  uVar5 = FunctionBody::GetInnerScopeCount(function);
  if (uVar5 != 0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffffbfffffffff | 0x4000000000);
    uVar5 = FunctionBody::GetInnerScopeCount(function);
    PrependInt32(this,builder,L"InnerScopeCount",uVar5,(BufferBuilderInt32 **)0x0);
  }
  PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(function);
  if (PVar3 != 0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffff7fffffffff | 0x8000000000);
    PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(function);
    PrependInt16(this,builder,L"ProfiledCallApplyCallSiteCount",PVar3,(BufferBuilderInt16 **)0x0);
  }
  PVar3 = FunctionBody::GetProfiledForInLoopCount(function);
  if (PVar3 != 0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xfffffeffffffffff | 0x10000000000);
    PVar3 = FunctionBody::GetProfiledForInLoopCount(function);
    PrependInt16(this,builder,L"ProfiledForInLoopCount",PVar3,(BufferBuilderInt16 **)0x0);
  }
  RVar4 = FunctionBody::GetLocalClosureRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xfffffdffffffffff | 0x20000000000);
    RVar4 = FunctionBody::GetLocalClosureRegister(function);
    PrependInt32(this,builder,L"LocalClosureRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetParamClosureRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xfffffbffffffffff | 0x40000000000);
    RVar4 = FunctionBody::GetParamClosureRegister(function);
    PrependInt32(this,builder,L"ParamClosureRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetLocalFrameDisplayRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xfffff7ffffffffff | 0x80000000000);
    RVar4 = FunctionBody::GetLocalFrameDisplayRegister(function);
    PrependInt32(this,builder,L"LocalFrameDisplayRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetEnvRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffefffffffffff | 0x100000000000);
    RVar4 = FunctionBody::GetEnvRegister(function);
    PrependInt32(this,builder,L"EnvRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetThisRegisterForEventHandler(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffdfffffffffff | 0x200000000000);
    RVar4 = FunctionBody::GetThisRegisterForEventHandler(function);
    PrependInt32(this,builder,L"ThisRegisterForEventHandler",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFirstInnerScopeRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffffbfffffffffff | 0x400000000000);
    RVar4 = FunctionBody::GetFirstInnerScopeRegister(function);
    PrependInt32(this,builder,L"FirstInnerScopeRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  RVar4 = FunctionBody::GetFuncExprScopeRegister(function);
  if (RVar4 != 0xffffffff) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffff7fffffffffff | 0x800000000000);
    RVar4 = FunctionBody::GetFuncExprScopeRegister(function);
    PrependInt32(this,builder,L"FuncExprScopeRegister",RVar4,(BufferBuilderInt32 **)0x0);
  }
  pLVar8 = FunctionBody::GetLoopHeaderArray(function);
  if (pLVar8 != (LoopHeader *)0x0) {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffefffffffffffff | 0x10000000000000);
    uVar5 = FunctionBody::GetLoopCount(function);
    for (hr_1 = 0; (uint)hr_1 < uVar5; hr_1 = hr_1 + 1) {
      PrependInt32(this,builder,L"Loop Header Start",pLVar8[(uint)hr_1].startOffset,
                   (BufferBuilderInt32 **)0x0);
      PrependInt32(this,builder,L"Loop Header End",pLVar8[(uint)hr_1].endOffset,
                   (BufferBuilderInt32 **)0x0);
    }
  }
  pAVar9 = FunctionBody::GetAsmJsFunctionInfo(function);
  if (pAVar9 == (AsmJsFunctionInfo *)0x0) {
    bVar2 = ParseableFunctionInfo::GetIsAsmjsMode(&function->super_ParseableFunctionInfo);
    if (bVar2) {
      *definedFields =
           (SerializedFieldList)((ulong)*definedFields & 0xffdfffffffffffff | 0x20000000000000);
      PrependByte(this,builder,L"Asm.js Info Kind",'\x02');
      AddAsmJsModuleInfo(this,builder,function);
    }
  }
  else {
    *definedFields =
         (SerializedFieldList)((ulong)*definedFields & 0xffdfffffffffffff | 0x20000000000000);
    PrependByte(this,builder,L"Asm.js Info Kind",'\x01');
    AddAsmJsFunctionInfo(this,builder,function);
  }
  bVar2 = FunctionBody::GetIsAsmJsFunction(function);
  if (bVar2) {
    AddAsmJsConstantTable(this,builder,function);
    ppBVar10 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                         ((WriteBarrierPtr *)&function->byteCodeBlock);
    this_local._4_4_ =
         RewriteAsmJsByteCodesInto
                   (this,builder,L"Rewritten Asm.js Byte Code",function,*ppBVar10,definedFields);
  }
  else {
    AddConstantTable(this,builder,function);
    ppBVar10 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                         ((WriteBarrierPtr *)&function->byteCodeBlock);
    this_local._4_4_ =
         RewriteByteCodesInto(this,builder,L"Rewritten Byte Code",function,*ppBVar10,definedFields);
  }
  if (-1 < this_local._4_4_) {
    propIds_00 = FunctionBody::GetFormalsPropIdArray(function,false);
    if (propIds_00 != (PropertyIdArray *)0x0) {
      *definedFields =
           (SerializedFieldList)((ulong)*definedFields & 0xff7fffffffffffff | 0x80000000000000);
      AddPropertyIdOfFormals(this,builder,propIds_00,function);
    }
    AddCacheIdToPropertyIdMap(this,builder,function);
    AddReferencedPropertyIdMap(this,builder,function);
    pAVar11 = FunctionBody::GetSlotIdInCachedScopeToNestedIndexArray(function);
    if (pAVar11 == (AuxArray<unsigned_int> *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfeffffffffffffff);
    }
    else {
      *definedFields =
           (SerializedFieldList)((ulong)*definedFields & 0xfeffffffffffffff | 0x100000000000000);
      AddSlotIdInCachedScopeToNestedIndexArray(this,builder,function);
    }
    pPVar12 = FunctionBody::GetCallSiteToCallApplyCallSiteArray(function);
    if (pPVar12 == (ProfileId *)0x0) {
      *definedFields = (SerializedFieldList)((ulong)*definedFields & 0xfdffffffffffffff);
    }
    else {
      *definedFields =
           (SerializedFieldList)((ulong)*definedFields & 0xfdffffffffffffff | 0x200000000000000);
      AddCallSiteToCallApplyCallSiteArray(this,builder,function);
    }
    debuggerScopeSlotArraySize_00 = GetDebuggerScopeSlotArrayCount(this,function);
    if (debuggerScopeSlotArraySize_00 != 0) {
      *definedFields =
           (SerializedFieldList)((ulong)*definedFields & 0xfbffffffffffffff | 0x400000000000000);
      PrependInt32(this,builder,L"Debugger Scope Slot Array Size",debuggerScopeSlotArraySize_00,
                   (BufferBuilderInt32 **)0x0);
      AddSlotArrayDebuggerScopes(this,builder,function,debuggerScopeSlotArraySize_00);
    }
    for (literalRegex._0_4_ = 0; uVar5 = FunctionBody::GetLiteralRegexCount(function),
        (uint)literalRegex < uVar5; literalRegex._0_4_ = (uint)literalRegex + 1) {
      source.m_content.ptr = (char16_t *)FunctionBody::GetLiteralRegex(function,(uint)literalRegex);
      if ((RegexPattern *)source.m_content.ptr == (RegexPattern *)0x0) {
        PrependInt32(this,builder,L"Literal regex source length",-1,(BufferBuilderInt32 **)0x0);
      }
      else {
        UnifiedRegex::RegexPattern::GetSource((RegexPattern *)local_78);
        cVar6 = InternalString::GetLength((InternalString *)local_78);
        PrependInt32(this,builder,L"Literal regex source length",cVar6,(BufferBuilderInt32 **)0x0);
        sz = InternalString::GetBuffer((InternalString *)local_78);
        cVar6 = InternalString::GetLength((InternalString *)local_78);
        PrependString16(this,builder,L"Literal regex source",sz,(cVar6 + 1) * 2);
        value = UnifiedRegex::RegexPattern::GetFlags((RegexPattern *)source.m_content.ptr);
        PrependByte(this,builder,L"Literal regex flags",value);
      }
    }
    PrependSmallSpanSequence(this,builder,L"Span Sequence",(function->m_sourceInfo).pSpanSequence);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT AddFunctionBody(BufferBuilderList &builder, FunctionBody *function, SRCINFO const *srcInfo, SerializedFieldList& definedFields)
    {
        Assert(!function->GetIsSerialized());
        DebugOnly(function->SetIsSerialized(true));

        // This field should always be non-zero
        Assert(function->GetConstantCount() != 0);

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

        {
#define DEFINE_FUNCTION_BODY_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
            if (function->##name != 0) { \
                definedFields.has_##name = true; \
                Prepend##serializableType(builder, _u(#name), function->##name); \
            }

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType) \
            Prepend##serializableType(builder, _u(#name), function->Get##name##());

#define DECLARE_SERIALIZABLE_ACCESSOR_FIELD(type, name, serializableType, defaultValue) \
            if (function->Get##name##() != defaultValue) { \
                definedFields.has_##name = true; \
                DECLARE_SERIALIZABLE_ACCESSOR_FIELD_NO_CHECK(type, name, serializableType); \
            }

#include "SerializableFunctionFields.h"
        }

        {
            auto loopHeaderArray = function->GetLoopHeaderArray();
            if (loopHeaderArray != nullptr)
            {
                definedFields.has_loopHeaderArray = true;
                uint loopCount = function->GetLoopCount();
                for (uint i = 0; i < loopCount; ++i)
                {
                    PrependInt32(builder, _u("Loop Header Start"), loopHeaderArray[i].startOffset);
                    PrependInt32(builder, _u("Loop Header End"), loopHeaderArray[i].endOffset);
                }
            }

#ifdef ASMJS_PLAT
            if (function->GetAsmJsFunctionInfo())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 1);
                AddAsmJsFunctionInfo(builder, function);
            }
            else if (function->GetIsAsmjsMode())
            {
                definedFields.has_asmJsInfo = true;
                PrependByte(builder, _u("Asm.js Info Kind"), 2);
                AddAsmJsModuleInfo(builder, function);
            }
#endif

#ifdef ASMJS_PLAT
            if (function->GetIsAsmJsFunction())
            {
                AddAsmJsConstantTable(builder, function);
                auto hr = RewriteAsmJsByteCodesInto(builder, _u("Rewritten Asm.js Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }
            else
#endif
            {
                AddConstantTable(builder, function);
                auto hr = RewriteByteCodesInto(builder, _u("Rewritten Byte Code"), function, function->byteCodeBlock, definedFields);
                if (FAILED(hr))
                {
                    return hr;
                }
            }

            PropertyIdArray * propIds = function->GetFormalsPropIdArray(false);
            if (propIds != nullptr)
            {
                definedFields.has_propertyIdOfFormals = true;
                AddPropertyIdOfFormals(builder, propIds, function);
            }

            AddCacheIdToPropertyIdMap(builder, function);
            AddReferencedPropertyIdMap(builder, function);

            if (function->GetSlotIdInCachedScopeToNestedIndexArray() == nullptr)
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = false;
            }
            else
            {
                definedFields.has_slotIdInCachedScopeToNestedIndexArray = true;
                AddSlotIdInCachedScopeToNestedIndexArray(builder, function);
            }

#if ENABLE_NATIVE_CODEGEN
            if (function->GetCallSiteToCallApplyCallSiteArray() == nullptr)
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = false;
            }
            else
            {
                definedFields.has_callSiteToCallApplyCallSiteArray = true;
                AddCallSiteToCallApplyCallSiteArray(builder, function);
            }
#else
            definedFields.has_callSiteToCallApplyCallSiteArray = false;
#endif

            uint debuggerScopeSlotArraySize = GetDebuggerScopeSlotArrayCount(function);
            if (debuggerScopeSlotArraySize != 0)
            {
                definedFields.has_debuggerScopeSlotArray = true;
                PrependInt32(builder, _u("Debugger Scope Slot Array Size"), debuggerScopeSlotArraySize);
                AddSlotArrayDebuggerScopes(builder, function, debuggerScopeSlotArraySize);
            }

            // Literal regexes
            for (uint i = 0; i < function->GetLiteralRegexCount(); ++i)
            {
                const auto literalRegex = function->GetLiteralRegex(i);
                if (!literalRegex)
                {
                    PrependInt32(builder, _u("Literal regex source length"), -1);
                    continue;
                }

                const auto source = literalRegex->GetSource();
                PrependInt32(builder, _u("Literal regex source length"), source.GetLength());
                PrependString16(builder, _u("Literal regex source"), source.GetBuffer(), (source.GetLength() + 1) * sizeof(char16));
                PrependByte(builder, _u("Literal regex flags"), literalRegex->GetFlags());
            }

            // Write the SourceInfo stuff
            PrependSmallSpanSequence(builder, _u("Span Sequence"), function->m_sourceInfo.pSpanSequence);
        }

        return S_OK;
    }